

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

int cinatra::detail::phr_parse_response
              (char *buf_start,size_t len,int *minor_version,int *status,char **msg,size_t *msg_len,
              http_header *headers,size_t *num_headers,size_t last_len)

{
  char *pcVar1;
  char *pcVar2;
  http_header *in_RCX;
  size_t *in_RDX;
  size_t in_RSI;
  int *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000010;
  size_t in_stack_00000018;
  int r;
  size_t max_headers;
  char *buf_end;
  char *buf;
  char **in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int *minor_version_00;
  int *ret;
  int local_c;
  
  pcVar1 = (char *)((long)in_RDI + in_RSI);
  minor_version_00 = (int *)*in_stack_00000010;
  *(undefined4 *)in_RDX = 0xffffffff;
  *(undefined4 *)&(in_RCX->name)._M_len = 0;
  *in_R8 = 0;
  *in_R9 = 0;
  *in_stack_00000010 = 0;
  ret = in_RDI;
  if (((in_stack_00000018 == 0) ||
      (pcVar2 = is_complete((char *)in_RDI,pcVar1,in_stack_00000018,(int *)&stack0xffffffffffffffa4)
      , local_c = in_stack_ffffffffffffffa4, pcVar2 != (char *)0x0)) &&
     (pcVar1 = parse_response((char *)in_RDI,pcVar1,minor_version_00,
                              (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98,(size_t *)&stack0xffffffffffffffa4,in_RCX,
                              in_RDX,in_RSI,ret), local_c = in_stack_ffffffffffffffa4,
     pcVar1 != (char *)0x0)) {
    local_c = (int)pcVar1 - (int)ret;
  }
  return local_c;
}

Assistant:

inline int phr_parse_response(const char *buf_start, size_t len,
                              int *minor_version, int *status, const char **msg,
                              size_t *msg_len, http_header *headers,
                              size_t *num_headers, size_t last_len) {
  const char *buf = buf_start, *buf_end = buf + len;
  size_t max_headers = *num_headers;
  int r;

  *minor_version = -1;
  *status = 0;
  *msg = NULL;
  *msg_len = 0;
  *num_headers = 0;

  /* if last_len != 0, check if the response is complete (a fast countermeasure
  against slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_response(buf, buf_end, minor_version, status, msg, msg_len,
                            headers, num_headers, max_headers, &r)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start);
}